

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O2

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  uint uVar1;
  long lVar2;
  uint32_t uVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') &&
     (iVar4 = __cxa_guard_acquire(), iVar4 != 0)) {
    uVar3 = ::crc32c::Extend(0,(uint8_t *)"TestCRCBuffer",0xd);
    Extend::accelerate = uVar3 == 0xdcbc59fa;
    __cxa_guard_release(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate);
  }
  if (Extend::accelerate == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      uVar3 = ::crc32c::Extend(crc,(uint8_t *)data,n);
      return uVar3;
    }
  }
  else {
    puVar10 = (uint *)(data + n);
    uVar15 = ~crc;
    puVar5 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
    puVar14 = (uint *)data;
    if (puVar5 <= puVar10) {
      for (; puVar14 = puVar5, (uint *)data != puVar5; data = (char *)((long)data + 1)) {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable +
                          (ulong)((uint)(byte)*(uint *)data ^ uVar15 & 0xff) * 4);
      }
    }
    if (0xf < (long)puVar10 - (long)puVar14) {
      uVar15 = uVar15 ^ *puVar14;
      uVar13 = puVar14[1];
      uVar7 = puVar14[2];
      uVar11 = puVar14[3];
      lVar6 = (long)puVar10 - (long)puVar14;
      puVar5 = puVar14;
      while( true ) {
        puVar14 = puVar5 + 4;
        lVar6 = lVar6 + -0x10;
        if (lVar6 < 0x10) break;
        uVar15 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                          (ulong)(uVar15 & 0xff) * 4) ^ *puVar14 ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar15 >> 8 & 0xff) * 4) ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
                 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(uVar15 >> 0x18) * 4);
        uVar13 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                          (ulong)(uVar13 & 0xff) * 4) ^ puVar5[5] ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
                 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(uVar13 >> 0x18) * 4);
        uVar7 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
                ^ puVar5[6] ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar7 >> 8 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                         );
        uVar11 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                          (ulong)(uVar11 & 0xff) * 4) ^ puVar5[7] ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar11 >> 8 & 0xff) * 4) ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar11 >> 0xe & 0x3fc))
                 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(uVar11 >> 0x18) * 4);
        puVar5 = puVar14;
      }
      for (; 3 < lVar6; lVar6 = lVar6 + -4) {
        uVar12 = uVar15 & 0xff;
        uVar1 = *puVar14;
        uVar8 = uVar15 >> 8;
        uVar9 = uVar15 >> 0xe;
        uVar16 = uVar15 >> 0x18;
        puVar14 = puVar14 + 1;
        uVar15 = uVar13;
        uVar13 = uVar7;
        uVar7 = uVar11;
        uVar11 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)uVar12 * 4) ^
                 uVar1 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                                  (ulong)(uVar8 & 0xff) * 4) ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar9 & 0x3fc)) ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar16 * 4);
      }
      lVar6 = 4;
      while (bVar17 = lVar6 != 0, lVar6 = lVar6 + -1, bVar17) {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar15 & 0xff) * 4);
      }
      uVar15 = uVar15 ^ uVar13;
      lVar6 = 4;
      while (bVar17 = lVar6 != 0, lVar6 = lVar6 + -1, bVar17) {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar15 & 0xff) * 4);
      }
      uVar15 = uVar15 ^ uVar7;
      lVar6 = 4;
      while (bVar17 = lVar6 != 0, lVar6 = lVar6 + -1, bVar17) {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar15 & 0xff) * 4);
      }
      uVar15 = uVar15 ^ uVar11;
      lVar6 = 4;
      while (bVar17 = lVar6 != 0, lVar6 = lVar6 + -1, bVar17) {
        uVar15 = uVar15 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar15 & 0xff) * 4);
      }
    }
    for (; puVar14 != puVar10; puVar14 = (uint *)((long)puVar14 + 1)) {
      uVar15 = uVar15 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable +
                        (ulong)((uint)(byte)*puVar14 ^ uVar15 & 0xff) * 4);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return ~uVar15;
    }
  }
  __stack_chk_fail();
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}